

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

UBool __thiscall icu_63::LocalizationInfo::operator==(LocalizationInfo *this,LocalizationInfo *rhs)

{
  UBool UVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  undefined4 extraout_var;
  UChar *pUVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  UChar *pUVar7;
  undefined4 extraout_var_00;
  
  if (rhs == (LocalizationInfo *)0x0) {
    return '\0';
  }
  if (this == rhs) {
LAB_0021344e:
    UVar1 = '\x01';
  }
  else {
    uVar2 = (*this->_vptr_LocalizationInfo[3])(this);
    uVar3 = (*rhs->_vptr_LocalizationInfo[3])(rhs);
    if (uVar2 == uVar3) {
      if (0 < (int)uVar2) {
        uVar9 = 0;
        do {
          iVar4 = (*this->_vptr_LocalizationInfo[4])(this,uVar9);
          pUVar7 = (UChar *)CONCAT44(extraout_var,iVar4);
          iVar4 = (*rhs->_vptr_LocalizationInfo[4])(rhs,uVar9);
          pUVar8 = (UChar *)CONCAT44(extraout_var_00,iVar4);
          if (pUVar8 != pUVar7) {
            if (pUVar7 == (UChar *)0x0) {
              return '\0';
            }
            if (pUVar8 == (UChar *)0x0) {
              return '\0';
            }
            iVar5 = u_strcmp_63(pUVar7,pUVar8);
            if (iVar5 != 0) goto LAB_00213455;
          }
          uVar3 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar3;
        } while (uVar2 != uVar3);
      }
      uVar3 = (*this->_vptr_LocalizationInfo[5])(this);
      uVar6 = (*rhs->_vptr_LocalizationInfo[5])(rhs);
      if (uVar3 == uVar6) {
        if (0 < (int)uVar3) {
          uVar9 = 0;
          do {
            iVar4 = (*this->_vptr_LocalizationInfo[6])(this,uVar9);
            pUVar7 = (UChar *)CONCAT44(extraout_var_01,iVar4);
            uVar6 = (*rhs->_vptr_LocalizationInfo[8])(rhs,pUVar7);
            iVar4 = (*rhs->_vptr_LocalizationInfo[6])(rhs);
            pUVar8 = (UChar *)CONCAT44(extraout_var_02,iVar4);
            if (pUVar8 != pUVar7) {
              if (pUVar7 == (UChar *)0x0) {
                return '\0';
              }
              if (pUVar8 == (UChar *)0x0) {
                return '\0';
              }
              iVar5 = u_strcmp_63(pUVar7,pUVar8);
              if (iVar5 != 0) goto LAB_00213455;
            }
            if (0 < (int)uVar2) {
              uVar11 = 0;
              do {
                iVar4 = (*this->_vptr_LocalizationInfo[7])(this,uVar9,uVar11);
                pUVar7 = (UChar *)CONCAT44(extraout_var_03,iVar4);
                iVar4 = (*rhs->_vptr_LocalizationInfo[7])(rhs,(ulong)uVar6,uVar11);
                pUVar8 = (UChar *)CONCAT44(extraout_var_04,iVar4);
                if (pUVar8 != pUVar7) {
                  if (pUVar7 == (UChar *)0x0) {
                    return '\0';
                  }
                  if (pUVar8 == (UChar *)0x0) {
                    return '\0';
                  }
                  iVar5 = u_strcmp_63(pUVar7,pUVar8);
                  if (iVar5 != 0) goto LAB_00213455;
                }
                uVar10 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar10;
              } while (uVar2 != uVar10);
            }
            uVar6 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar6;
          } while (uVar6 != uVar3);
        }
        goto LAB_0021344e;
      }
    }
LAB_00213455:
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
LocalizationInfo::operator==(const LocalizationInfo* rhs) const {
    if (rhs) {
        if (this == rhs) {
            return TRUE;
        }
        
        int32_t rsc = getNumberOfRuleSets();
        if (rsc == rhs->getNumberOfRuleSets()) {
            for (int i = 0; i < rsc; ++i) {
                if (!streq(getRuleSetName(i), rhs->getRuleSetName(i))) {
                    return FALSE;
                }
            }
            int32_t dlc = getNumberOfDisplayLocales();
            if (dlc == rhs->getNumberOfDisplayLocales()) {
                for (int i = 0; i < dlc; ++i) {
                    const UChar* locale = getLocaleName(i);
                    int32_t ix = rhs->indexForLocale(locale);
                    // if no locale, ix is -1, getLocaleName returns null, so streq returns false
                    if (!streq(locale, rhs->getLocaleName(ix))) {
                        return FALSE;
                    }
                    for (int j = 0; j < rsc; ++j) {
                        if (!streq(getDisplayName(i, j), rhs->getDisplayName(ix, j))) {
                            return FALSE;
                        }
                    }
                }
                return TRUE;
            }
        }
    }
    return FALSE;
}